

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O1

Vec_Int_t * Tim_ManAlignTwo(Tim_Man_t *pSpec,Tim_Man_t *pImpl)

{
  Vec_Ptr_t *pVVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Vec_Int_t *pVVar4;
  int *__s;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  pVVar1 = pSpec->vBoxes;
  iVar8 = 0;
  iVar5 = 0;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    iVar5 = pVVar1->nSize;
  }
  pVVar2 = pImpl->vBoxes;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    iVar8 = pVVar2->nSize;
  }
  if (iVar5 <= iVar8) {
    __assert_fail("Tim_ManBoxNum(pSpec) > Tim_ManBoxNum(pImpl)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                  ,0x160,"Vec_Int_t *Tim_ManAlignTwo(Tim_Man_t *, Tim_Man_t *)");
  }
  if (0 < (long)pVVar2->nSize) {
    lVar7 = 0;
    do {
      iVar5 = *(int *)((long)pVVar2->pArray[lVar7] + 0x14);
      if (iVar5 < 0) {
        return (Vec_Int_t *)0x0;
      }
      if (pVVar1 == (Vec_Ptr_t *)0x0) {
        iVar8 = 0;
      }
      else {
        iVar8 = pVVar1->nSize;
      }
      if (iVar8 <= iVar5) {
        return (Vec_Int_t *)0x0;
      }
      lVar7 = lVar7 + 1;
    } while (pVVar2->nSize != lVar7);
  }
  if (pVVar1 == (Vec_Ptr_t *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = pVVar1->nSize;
  }
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar8 = iVar5;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar8;
  if (iVar8 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar8 << 2);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = iVar5;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)iVar5 << 2);
  }
  if (0 < pVVar2->nSize) {
    ppvVar3 = pVVar2->pArray;
    lVar7 = 0;
    do {
      iVar8 = *(int *)((long)ppvVar3[lVar7] + 0x14);
      lVar6 = (long)iVar8;
      if ((lVar6 < 0) || (iVar5 <= iVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (__s[lVar6] != 0) {
        __assert_fail("!Vec_IntEntry(vBoxPres, pBox->iCopy)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                      ,0x169,"Vec_Int_t *Tim_ManAlignTwo(Tim_Man_t *, Tim_Man_t *)");
      }
      __s[lVar6] = 1;
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar2->nSize);
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Tim_ManAlignTwo( Tim_Man_t * pSpec, Tim_Man_t * pImpl )
{
    Vec_Int_t * vBoxPres;
    Tim_Box_t * pBox;
    int i;
    assert( Tim_ManBoxNum(pSpec) > Tim_ManBoxNum(pImpl) );
    // check if boxes of pImpl can be aligned
    Tim_ManForEachBox( pImpl, pBox, i )
        if ( pBox->iCopy < 0 || pBox->iCopy >= Tim_ManBoxNum(pSpec) ) 
            return NULL;
    // map dropped boxes into 1, others into 0
    vBoxPres = Vec_IntStart( Tim_ManBoxNum(pSpec) );
    Tim_ManForEachBox( pImpl, pBox, i )
    {
        assert( !Vec_IntEntry(vBoxPres, pBox->iCopy) );
        Vec_IntWriteEntry( vBoxPres, pBox->iCopy, 1 );
    }
    return vBoxPres;
}